

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int __thiscall CVmObjDate::compare_to(CVmObjDate *this,vm_obj_id_t param_2,vm_val_t *val)

{
  int iVar1;
  int iVar2;
  CVmObject *this_00;
  vm_date_ext *pvVar3;
  int *in_RDX;
  CVmObjDate *in_RDI;
  int32_t time2;
  int32_t time1;
  int32_t day2;
  int32_t day1;
  CVmObjDate *vdate;
  int local_3c;
  
  if (*in_RDX == 5) {
    iVar2 = is_date_obj(0);
    if (iVar2 != 0) {
      this_00 = vm_objp(0);
      pvVar3 = get_ext(in_RDI);
      local_3c = pvVar3->dayno;
      pvVar3 = get_ext((CVmObjDate *)this_00);
      iVar2 = pvVar3->dayno;
      pvVar3 = get_ext(in_RDI);
      iVar1 = pvVar3->daytime;
      pvVar3 = get_ext((CVmObjDate *)this_00);
      if (local_3c == iVar2) {
        local_3c = iVar1 - pvVar3->daytime;
      }
      else {
        local_3c = local_3c - iVar2;
      }
      return local_3c;
    }
  }
  err_throw(0);
}

Assistant:

int CVmObjDate::compare_to(VMG_ vm_obj_id_t, const vm_val_t *val) const
{
    /* check the other object's type */
    if (val->typ == VM_OBJ && is_date_obj(vmg_ val->val.obj))
    {
        /* it's a Date - get the two day number and time values */
        CVmObjDate *vdate = (CVmObjDate *)vm_objp(vmg_ val->val.obj);
        int32_t day1 = get_ext()->dayno, day2 = vdate->get_ext()->dayno;
        int32_t time1 = get_ext()->daytime, time2 = vdate->get_ext()->daytime;

        /* compare by date and time */
        return (day1 != day2 ? day1 - day2 : time1 - time2);
    }
    else
    {
        /* we can't compare to other types */
        err_throw(VMERR_INVALID_COMPARISON);
        AFTER_ERR_THROW(return 0;)
    }
}